

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,QVariant>::emplace<QVariant_const&>
          (QHash<QString,_QVariant> *this,QString *key,QVariant *args)

{
  long lVar1;
  QHash<QString,_QVariant> *in_RDX;
  QString *in_RDI;
  long in_FS_OFFSET;
  piter pVar2;
  QString copy;
  QString *in_stack_ffffffffffffff88;
  QVariant *in_stack_ffffffffffffffa0;
  QString *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_RDI,in_stack_ffffffffffffff88);
  pVar2 = (piter)emplace<QVariant_const&>
                           (in_RDX,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QString::~QString((QString *)0x211e76);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)pVar2;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(const Key &key, Args &&... args)
    {
        Key copy = key; // Needs to be explicit for MSVC 2019
        return emplace(std::move(copy), std::forward<Args>(args)...);
    }